

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LJ.cpp
# Opt level: O0

void __thiscall OpenMD::LJ::LJ(LJ *this)

{
  undefined8 *in_RDI;
  VanDerWaalsInteraction *in_stack_ffffffffffffffb0;
  allocator<char> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffff0;
  
  VanDerWaalsInteraction::VanDerWaalsInteraction(in_stack_ffffffffffffffb0);
  *in_RDI = &PTR__LJ_0050c5a0;
  *(undefined1 *)(in_RDI + 1) = 0;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x3a93d8);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x3a93eb);
  std::
  vector<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>,_std::allocator<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>_>_>
  ::vector((vector<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>,_std::allocator<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>_>_>
            *)0x3a93fe);
  in_RDI[0xf] = 0;
  std::set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>::set
            ((set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
              *)0x3a9419);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffff7);
  return;
}

Assistant:

LJ::LJ() : initialized_(false), forceField_(NULL), name_("LJ") {}